

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

double __thiscall doctest::detail::ResultBuilder::log(ResultBuilder *this,double __x)

{
  int *piVar1;
  Enum EVar2;
  char *pcVar3;
  undefined8 *puVar4;
  byte bVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  undefined8 uVar9;
  String *pSVar10;
  long lVar11;
  IReporter **curr_rep;
  undefined8 *puVar12;
  long *in_FS_OFFSET;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  anon_union_24_2_13149d16_for_String_2 local_a0;
  String local_88;
  String local_70;
  anon_union_24_2_13149d16_for_String_2 local_58;
  String local_40;
  
  EVar2 = (this->super_AssertData).m_at;
  if ((EVar2 & is_throws) == 0) {
    if ((~EVar2 & 0x60) == 0) {
      if ((this->super_AssertData).m_threw_as == true) {
        String::String((String *)&local_58.data,(this->super_AssertData).m_exception_string);
        uVar9 = &local_58;
        if (local_58.buf[0x17] < '\0') {
          uVar9 = local_58.data.ptr;
        }
        if ((this->super_AssertData).m_exception.field_0.buf[0x17] < '\0') {
          pSVar10 = (String *)(this->super_AssertData).m_exception.field_0.data.ptr;
        }
        else {
          pSVar10 = &(this->super_AssertData).m_exception;
        }
        iVar7 = strcmp((char *)pSVar10,(char *)uVar9);
        (this->super_AssertData).m_failed = iVar7 != 0;
        String::~String((String *)&local_58.data);
        __x = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      }
      else {
        (this->super_AssertData).m_failed = true;
      }
      goto LAB_0010a48c;
    }
    if ((EVar2 & is_throws_as) != 0) {
      bVar5 = (this->super_AssertData).m_threw_as;
      goto LAB_0010a44b;
    }
    if ((EVar2 & is_throws_with) != 0) {
      String::String((String *)&local_58.data,(this->super_AssertData).m_exception_string);
      uVar9 = &local_58;
      if (local_58.buf[0x17] < '\0') {
        uVar9 = local_58.data.ptr;
      }
      if ((this->super_AssertData).m_exception.field_0.buf[0x17] < '\0') {
        pSVar10 = (String *)(this->super_AssertData).m_exception.field_0.data.ptr;
      }
      else {
        pSVar10 = &(this->super_AssertData).m_exception;
      }
      iVar7 = strcmp((char *)pSVar10,(char *)uVar9);
      (this->super_AssertData).m_failed = iVar7 != 0;
      String::~String((String *)&local_58.data);
      __x = (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02);
      goto LAB_0010a48c;
    }
    if (-1 < (char)EVar2) goto LAB_0010a48c;
    bVar5 = (this->super_AssertData).m_threw;
  }
  else {
    bVar5 = (this->super_AssertData).m_threw;
LAB_0010a44b:
    bVar5 = bVar5 ^ 1;
  }
  (this->super_AssertData).m_failed = (bool)bVar5;
LAB_0010a48c:
  bVar5 = (this->super_AssertData).m_exception.field_0.buf[0x17];
  if ((char)bVar5 < '\0') {
    uVar8 = (this->super_AssertData).m_exception.field_0.data.size;
  }
  else {
    uVar8 = 0x17 - (bVar5 & 0x1f);
  }
  if (uVar8 != 0) {
    pSVar10 = &(this->super_AssertData).m_exception;
    String::String(&local_40,"\"");
    operator+(&local_70,&local_40,pSVar10);
    String::String(&local_88,"\"");
    operator+((String *)&local_a0.data,&local_70,&local_88);
    if (&pSVar10->field_0 != &local_a0) {
      if (((this->super_AssertData).m_exception.field_0.buf[0x17] < '\0') &&
         (pcVar3 = (pSVar10->field_0).data.ptr, pcVar3 != (char *)0x0)) {
        operator_delete__(pcVar3);
      }
      *(ulong *)((long)&(this->super_AssertData).m_exception.field_0 + 0x10) =
           CONCAT17(local_a0.buf[0x17],local_a0._16_7_);
      (pSVar10->field_0).data.ptr = (char *)CONCAT71(local_a0._1_7_,local_a0.buf[0]);
      *(undefined8 *)((long)&(this->super_AssertData).m_exception.field_0 + 8) = local_a0._8_8_;
      local_a0.buf[0] = '\0';
      local_a0.buf[0x17] = '\x17';
    }
    String::~String((String *)&local_a0.data);
    String::~String(&local_88);
    String::~String(&local_70);
    String::~String(&local_40);
    __x = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
  }
  if (is_running_in_test == '\x01') {
    if (((this->super_AssertData).m_at & is_warn) == 0) {
      lVar11 = g_cs + 0xb8;
      if (*(char *)(*in_FS_OFFSET + -8) == '\0') {
        __x = log(__x);
      }
      LOCK();
      piVar1 = (int *)(lVar11 + *(long *)(*in_FS_OFFSET + -0x10) * 0x40);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    puVar4 = *(undefined8 **)(g_cs + 0x10d8);
    for (puVar12 = *(undefined8 **)(g_cs + 0x10d0); puVar12 != puVar4; puVar12 = puVar12 + 1) {
      __x = (double)(**(code **)(*(long *)*puVar12 + 0x48))((long *)*puVar12,this);
    }
    if (((this->super_AssertData).m_failed != false) &&
       (((this->super_AssertData).m_at & is_warn) == 0)) {
      lVar11 = g_cs + 0x8b8;
      if (*(char *)(*in_FS_OFFSET + -8) == '\0') {
        __x = log(__x);
      }
      LOCK();
      piVar1 = (int *)(lVar11 + *(long *)(*in_FS_OFFSET + -0x10) * 0x40);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
  }
  else if ((this->super_AssertData).m_failed == true) {
    if (*(code **)(g_cs + 0x10e8) == (code *)0x0) {
      abort();
    }
    __x = (double)(**(code **)(g_cs + 0x10e8))(this);
  }
  if ((this->super_AssertData).m_failed == true) {
    bVar6 = isDebuggerActive();
    __x = (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
    if (bVar6) {
      __x = (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
    }
  }
  return __x;
}

Assistant:

bool ResultBuilder::log() {
        if(m_at & assertType::is_throws) { //!OCLINT bitwise operator in conditional
            m_failed = !m_threw;
        } else if((m_at & assertType::is_throws_as) && (m_at & assertType::is_throws_with)) { //!OCLINT
            m_failed = !m_threw_as || (m_exception != m_exception_string);
        } else if(m_at & assertType::is_throws_as) { //!OCLINT bitwise operator in conditional
            m_failed = !m_threw_as;
        } else if(m_at & assertType::is_throws_with) { //!OCLINT bitwise operator in conditional
            m_failed = m_exception != m_exception_string;
        } else if(m_at & assertType::is_nothrow) { //!OCLINT bitwise operator in conditional
            m_failed = m_threw;
        }

        if(m_exception.size())
            m_exception = "\"" + m_exception + "\"";

        if(is_running_in_test) {
            addAssert(m_at);
            DOCTEST_ITERATE_THROUGH_REPORTERS(log_assert, *this);

            if(m_failed)
                addFailedAssert(m_at);
        } else if(m_failed) {
            failed_out_of_a_testing_context(*this);
        }

        return m_failed && isDebuggerActive() && !getContextOptions()->no_breaks &&
            (g_cs->currentTest == nullptr || !g_cs->currentTest->m_no_breaks); // break into debugger
    }